

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O2

int pt_blk_add_trampoline(pt_block_cache *bcache,uint64_t ip,uint64_t nip,pt_exec_mode mode)

{
  pt_bcache_entry bce;
  int iVar1;
  long lVar2;
  
  lVar2 = nip - ip;
  iVar1 = (mode & ptem_64bit) * 0x1000000;
  bce = (pt_bcache_entry)(iVar1 + 0x14010000);
  if ((short)lVar2 == lVar2) {
    bce = (pt_bcache_entry)(iVar1 + ((uint)lVar2 & 0xffff) + 0x10000);
  }
  iVar1 = pt_bcache_add(bcache,ip,bce);
  return iVar1;
}

Assistant:

static inline int pt_blk_add_trampoline(struct pt_block_cache *bcache,
					uint64_t ip, uint64_t nip,
					enum pt_exec_mode mode)
{
	struct pt_bcache_entry bce;
	int64_t disp;

	/* The displacement from @ip to @nip for the trampoline. */
	disp = (int64_t) (nip - ip);

	memset(&bce, 0, sizeof(bce));
	bce.displacement = (int32_t) disp;
	bce.ninsn = 1;
	bce.mode = mode;
	bce.qualifier = ptbq_again;

	/* If we can't reach @nip without overflowing the displacement field, we
	 * have to stop and re-decode the instruction at @ip.
	 */
	if ((int64_t) bce.displacement != disp) {

		memset(&bce, 0, sizeof(bce));
		bce.ninsn = 1;
		bce.mode = mode;
		bce.qualifier = ptbq_decode;
	}

	return pt_bcache_add(bcache, ip, bce);
}